

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::ConversionExpression::fromSyntax
          (ConversionExpression *this,Compilation *comp,CastExpressionSyntax *syntax,
          ASTContext *context,Type *assignmentTarget)

{
  undefined4 __fd;
  _Optional_payload_base<int> _Var1;
  bool bVar2;
  bitmask<slang::ast::IntegralFlags> flags;
  int iVar3;
  undefined4 extraout_var;
  Expression *pEVar4;
  Symbol *pSVar5;
  SourceLocation SVar6;
  Diagnostic *pDVar7;
  _Optional_payload_base<int> _Var8;
  Diagnostic *diag;
  ConversionExpression *pCVar9;
  _Optional_payload_base<int> unaff_RBP;
  SourceRange SVar10;
  SourceRange SVar11;
  SourceRange sourceRange;
  Expression *operand;
  Type *type;
  anon_class_32_4_0791e916 result;
  undefined4 in_stack_ffffffffffffff7c;
  _Optional_payload_base<int> in_stack_ffffffffffffff80;
  _Optional_payload_base<int> local_78;
  ConversionKind local_6c;
  Type *local_68;
  Compilation *local_60;
  RandomizeDetails *local_58;
  AssertionInstanceDetails *local_50;
  Compilation *local_48;
  SourceRange local_40;
  
  __fd = (comp->options).maxCheckerInstanceDepth;
  iVar3 = Expression::bind(__fd,(sockaddr *)syntax,4);
  pEVar4 = (Expression *)CONCAT44(extraout_var,iVar3);
  bVar2 = Expression::bad(pEVar4);
  if (bVar2) {
LAB_004a85e4:
    pEVar4 = Expression::badExpr((Compilation *)this,(Expression *)0x0);
    return pEVar4;
  }
  local_78._M_payload = (_Storage<int,_true>)this[5].super_Expression.kind;
  local_78._M_engaged = (bool)this[5].super_Expression.field_0x4;
  local_78._5_3_ = *(undefined3 *)&this[5].super_Expression.field_0x5;
  local_68 = (Type *)context;
  if (pEVar4->kind == DataType) {
    local_78 = (_Optional_payload_base<int>)(pEVar4->type).ptr;
    bVar2 = Type::isSimpleType((Type *)local_78);
    _Var8 = local_78;
    if (!bVar2) {
      if (*(long *)((long)local_78 + 0x40) == 0) {
        Type::resolveCanonical((Type *)local_78);
      }
      _Var1 = local_78;
      unaff_RBP = _Var8;
      if (**(int **)((long)_Var8 + 0x40) != 0x24) {
        if (*(long *)((long)local_78 + 0x40) == 0) {
          Type::resolveCanonical((Type *)local_78);
        }
        unaff_RBP = _Var1;
        if ((**(int **)((long)_Var1 + 0x40) != 0x1b) &&
           (**(int **)&(comp->options).maxCheckerInstanceDepth != 0x1dc)) {
          pDVar7 = ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x200007,pEVar4->sourceRange);
          ast::operator<<(pDVar7,(Type *)local_78);
          goto LAB_004a85e4;
        }
      }
    }
    assignmentTarget = (Type *)local_78;
    in_stack_ffffffffffffff80 =
         (_Optional_payload_base<int>)
         Expression::create((Compilation *)this,
                            *(ExpressionSyntax **)&(comp->options).maxInstanceArray,
                            (ASTContext *)syntax,(bitmask<slang::ast::ASTFlags>)0x80,
                            (Type *)local_78);
    bVar2 = Expression::bad((Expression *)in_stack_ffffffffffffff80);
    if (bVar2) goto LAB_004a85e4;
  }
  else {
    unaff_RBP = (_Optional_payload_base<int>)
                ASTContext::evalInteger
                          ((ASTContext *)syntax,pEVar4,(bitmask<slang::ast::EvalFlags>)0x0);
    if ((((ulong)unaff_RBP >> 0x20 & 1) == 0) ||
       (bVar2 = ASTContext::requireGtZero
                          ((ASTContext *)syntax,(optional<int>)unaff_RBP,pEVar4->sourceRange),
       !bVar2)) {
LAB_004a87df:
      bVar2 = false;
      unaff_RBP = (_Optional_payload_base<int>)
                  Expression::badExpr((Compilation *)this,(Expression *)0x0);
    }
    else {
      bVar2 = ASTContext::requireValidBitWidth
                        ((ASTContext *)syntax,unaff_RBP._M_payload._M_value,pEVar4->sourceRange);
      if (!bVar2) goto LAB_004a87df;
      assignmentTarget._0_4_ = (_Storage<int,_true>)0x0;
      assignmentTarget._4_1_ = false;
      assignmentTarget._5_3_ = 0;
      in_stack_ffffffffffffff80 =
           (_Optional_payload_base<int>)
           Expression::create((Compilation *)this,
                              *(ExpressionSyntax **)&(comp->options).maxInstanceArray,
                              (ASTContext *)syntax,(bitmask<slang::ast::ASTFlags>)0x80,(Type *)0x0);
      bVar2 = Expression::bad((Expression *)in_stack_ffffffffffffff80);
      if (bVar2) goto LAB_004a87df;
      bVar2 = Type::isIntegral(*(Type **)((long)in_stack_ffffffffffffff80 + 8));
      if (!bVar2) {
        SVar6 = parsing::Token::location((Token *)&(comp->options).maxConstexprDepth);
        pDVar7 = ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x250007,SVar6);
        ast::operator<<(pDVar7,*(Type **)((long)in_stack_ffffffffffffff80 + 8));
        pDVar7 = Diagnostic::operator<<(pDVar7,pEVar4->sourceRange);
        Diagnostic::operator<<(pDVar7,*(SourceRange *)((long)in_stack_ffffffffffffff80 + 0x20));
        goto LAB_004a87df;
      }
      flags = Type::getIntegralFlags(*(Type **)((long)in_stack_ffffffffffffff80 + 8));
      local_78 = (_Optional_payload_base<int>)
                 Compilation::getType((Compilation *)this,unaff_RBP._M_payload._M_value,flags);
      bVar2 = true;
    }
    if (!bVar2) {
      return (Expression *)unaff_RBP;
    }
  }
  local_58 = (RandomizeDetails *)&local_78;
  local_50 = (AssertionInstanceDetails *)&stack0xffffffffffffff80;
  local_60 = (Compilation *)this;
  local_48 = comp;
  bVar2 = Type::isCastCompatible((Type *)local_78,*(Type **)((long)in_stack_ffffffffffffff80 + 8));
  if (bVar2) {
    bVar2 = Type::isMatching((Type *)local_78,*(Type **)((long)in_stack_ffffffffffffff80 + 8));
    if ((((bVar2) &&
         ((pSVar5 = Expression::getSymbolReference((Expression *)in_stack_ffffffffffffff80,true),
          pSVar5 == (Symbol *)0x0 ||
          ((pSVar5->kind != Genvar &&
           ((pSVar5->kind != Parameter || (pSVar5[5].field_0x34 == '\0')))))))) &&
        (((*(int *)local_78 != 0x23 && (**(int **)((long)in_stack_ffffffffffffff80 + 8) != 0x23)) ||
         (local_78 == *(_Optional_payload_base<int> *)((long)in_stack_ffffffffffffff80 + 8))))) &&
       ((((local_68 != (Type *)0x0 && (bVar2 = Type::isMatching(local_68,(Type *)local_78), bVar2))
         && (*(int *)in_stack_ffffffffffffff80 != 0xc)) ||
        (bVar2 = actuallyNeededCast((Type *)local_78,(Expression *)in_stack_ffffffffffffff80),
        !bVar2)))) {
      SVar6 = parsing::Token::location((Token *)&(comp->options).maxConstexprDepth);
      pDVar7 = ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0xd90007,SVar6);
      pDVar7 = ast::operator<<(pDVar7,*(Type **)((long)in_stack_ffffffffffffff80 + 8));
      pDVar7 = Diagnostic::operator<<(pDVar7,pEVar4->sourceRange);
      Diagnostic::operator<<(pDVar7,*(SourceRange *)((long)in_stack_ffffffffffffff80 + 0x20));
    }
    bVar2 = Type::isAssignmentCompatible
                      ((Type *)local_78,*(Type **)((long)in_stack_ffffffffffffff80 + 8));
    _Var8 = local_78;
    if (bVar2) {
      bVar2 = Type::isNumeric((Type *)local_78);
      if ((bVar2) &&
         (bVar2 = Type::isNumeric(*(Type **)((long)in_stack_ffffffffffffff80 + 8)), bVar2)) {
        _Var8 = (_Optional_payload_base<int>)
                OpInfo::binaryType((Compilation *)this,(Type *)local_78,
                                   *(Type **)((long)in_stack_ffffffffffffff80 + 8),false,true);
      }
      SVar10 = parsing::Token::range((Token *)&(comp->options).maxConstexprDepth);
      SVar11.startLoc._4_4_ = in_stack_ffffffffffffff7c;
      SVar11.startLoc._0_4_ = 3;
      SVar11.endLoc = (SourceLocation)in_stack_ffffffffffffff80;
      Expression::contextDetermined
                ((Expression *)syntax,(ASTContext *)&stack0xffffffffffffff80,(Expression **)0x0,
                 (Expression *)_Var8,(Type *)SVar10.startLoc,SVar11,SVar10.endLoc._0_4_);
      bVar2 = true;
      if ((*(int *)in_stack_ffffffffffffff80 == 0x16) &&
         (1 < *(int *)((long)in_stack_ffffffffffffff80 + 0x30))) {
        unaff_RBP = in_stack_ffffffffffffff80;
        SVar11 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)comp);
        *(SourceRange *)((long)unaff_RBP + 0x20) = SVar11;
        *(_Optional_payload_base<int> *)((long)unaff_RBP + 8) = local_78;
        bVar2 = false;
        in_stack_ffffffffffffff80 = unaff_RBP;
      }
      if (!bVar2) {
        return (Expression *)unaff_RBP;
      }
    }
    else {
      Expression::selfDetermined((ASTContext *)syntax,(Expression **)&stack0xffffffffffffff80);
    }
    local_6c = Explicit;
    goto LAB_004a8a5f;
  }
  SVar10.endLoc = (SourceLocation)assignmentTarget;
  SVar10.startLoc = (pEVar4->sourceRange).endLoc;
  bVar2 = Bitstream::checkClassAccess
                    ((Bitstream *)local_78,(Type *)syntax,
                     (ASTContext *)(pEVar4->sourceRange).startLoc,SVar10);
  _Var8 = local_78;
  if (!bVar2) {
    local_6c = Explicit;
    local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)comp);
    pCVar9 = BumpAllocator::
             emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange>
                       ((BumpAllocator *)this,(Type *)_Var8,&stack0xffffffffffffff94,
                        (Expression *)in_stack_ffffffffffffff80,&stack0xffffffffffffffc0);
    goto LAB_004a8b81;
  }
  if (*(int *)in_stack_ffffffffffffff80 == 0x11) {
    bVar2 = Bitstream::isBitstreamCast
                      ((Type *)local_78,
                       (StreamingConcatenationExpression *)in_stack_ffffffffffffff80);
    if (bVar2) {
LAB_004a8afd:
      local_6c = BitstreamCast;
LAB_004a8a5f:
      _Var8 = local_78;
      local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)comp);
      pCVar9 = BumpAllocator::
               emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind&,slang::ast::Expression&,slang::SourceRange>
                         ((BumpAllocator *)this,(Type *)_Var8,&stack0xffffffffffffff94,
                          (Expression *)in_stack_ffffffffffffff80,&stack0xffffffffffffffc0);
      return &pCVar9->super_Expression;
    }
    SVar6 = parsing::Token::location((Token *)&(comp->options).maxConstexprDepth);
    diag = ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x290007,SVar6);
    pDVar7 = diag;
LAB_004a8b3e:
    ast::operator<<(diag,(Type *)local_78);
    pDVar7 = Diagnostic::operator<<(pDVar7,pEVar4->sourceRange);
    Diagnostic::operator<<(pDVar7,*(SourceRange *)((long)in_stack_ffffffffffffff80 + 0x20));
  }
  else {
    bVar2 = Type::isBitstreamCastable
                      ((Type *)local_78,*(Type **)((long)in_stack_ffffffffffffff80 + 8));
    if (!bVar2) {
      SVar6 = parsing::Token::location((Token *)&(comp->options).maxConstexprDepth);
      pDVar7 = ASTContext::addDiag((ASTContext *)syntax,(DiagCode)0x230007,SVar6);
      diag = ast::operator<<(pDVar7,*(Type **)((long)in_stack_ffffffffffffff80 + 8));
      goto LAB_004a8b3e;
    }
    sourceRange.endLoc = (SourceLocation)assignmentTarget;
    sourceRange.startLoc = *(SourceLocation *)((long)in_stack_ffffffffffffff80 + 0x28);
    bVar2 = Bitstream::checkClassAccess
                      (*(Bitstream **)((long)in_stack_ffffffffffffff80 + 8),(Type *)syntax,
                       *(ASTContext **)((long)in_stack_ffffffffffffff80 + 0x20),sourceRange);
    if (bVar2) goto LAB_004a8afd;
  }
  pCVar9 = fromSyntax::anon_class_32_4_0791e916::operator()
                     ((anon_class_32_4_0791e916 *)&stack0xffffffffffffffa0,Explicit);
LAB_004a8b81:
  pEVar4 = Expression::badExpr((Compilation *)this,&pCVar9->super_Expression);
  return pEVar4;
}

Assistant:

Expression& ConversionExpression::fromSyntax(Compilation& comp, const CastExpressionSyntax& syntax,
                                             const ASTContext& context,
                                             const Type* assignmentTarget) {
    auto& targetExpr = bind(*syntax.left, context, ASTFlags::AllowDataType);
    if (targetExpr.bad())
        return badExpr(comp, nullptr);

    auto type = &comp.getErrorType();
    Expression* operand;
    if (targetExpr.kind == ExpressionKind::DataType) {
        type = targetExpr.type;
        if (!type->isSimpleType() && !type->isError() && !type->isString() &&
            syntax.left->kind != SyntaxKind::TypeReference) {
            context.addDiag(diag::BadCastType, targetExpr.sourceRange) << *type;
            return badExpr(comp, nullptr);
        }

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed, type);
        if (operand->bad())
            return badExpr(comp, nullptr);
    }
    else {
        auto val = context.evalInteger(targetExpr);
        if (!val || !context.requireGtZero(val, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        bitwidth_t width = bitwidth_t(*val);
        if (!context.requireValidBitWidth(width, targetExpr.sourceRange))
            return badExpr(comp, nullptr);

        operand = &create(comp, *syntax.right, context, ASTFlags::StreamingAllowed);
        if (operand->bad())
            return badExpr(comp, nullptr);

        if (!operand->type->isIntegral()) {
            auto& diag = context.addDiag(diag::BadIntegerCast, syntax.apostrophe.location());
            diag << *operand->type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, nullptr);
        }

        type = &comp.getType(width, operand->type->getIntegralFlags());
    }

    auto result = [&](ConversionKind cast = ConversionKind::Explicit) {
        return comp.emplace<ConversionExpression>(*type, cast, *operand, syntax.sourceRange());
    };

    if (!type->isCastCompatible(*operand->type)) {
        if (!Bitstream::checkClassAccess(*type, context, targetExpr.sourceRange)) {
            return badExpr(comp, result());
        }

        if (operand->kind == ExpressionKind::Streaming) {
            if (!Bitstream::isBitstreamCast(*type,
                                            operand->as<StreamingConcatenationExpression>())) {
                auto& diag = context.addDiag(diag::BadStreamCast, syntax.apostrophe.location());
                diag << *type;
                diag << targetExpr.sourceRange << operand->sourceRange;
                return badExpr(comp, result());
            }
        }
        else if (!type->isBitstreamCastable(*operand->type)) {
            auto& diag = context.addDiag(diag::BadConversion, syntax.apostrophe.location());
            diag << *operand->type << *type;
            diag << targetExpr.sourceRange << operand->sourceRange;
            return badExpr(comp, result());
        }
        else if (!Bitstream::checkClassAccess(*operand->type, context, operand->sourceRange)) {
            return badExpr(comp, result());
        }

        return *result(ConversionKind::BitstreamCast);
    }

    // We have a useless cast if the type of the operand matches what we're casting to, unless:
    // - We needed the assignment-like context of the cast (like for an unpacked array concat)
    // - We weren't already in an assignment-like context of the correct type
    // - We're casting a genvar (people dislike seeing warnings about genvar operands)
    // - We're casting to a different typedef even if it's a matching underlying type
    auto isGenvar = [&] {
        if (auto sym = operand->getSymbolReference()) {
            return sym->kind == SymbolKind::Genvar || (sym->kind == SymbolKind::Parameter &&
                                                       sym->as<ParameterSymbol>().isFromGenvar());
        }
        return false;
    };

    auto isDifferentTypedef = [&] {
        return (type->isAlias() || operand->type->isAlias()) && type != operand->type;
    };

    if (type->isMatching(*operand->type) && !isGenvar() && !isDifferentTypedef() &&
        ((assignmentTarget && assignmentTarget->isMatching(*type) &&
          operand->kind != ExpressionKind::ConditionalOp) ||
         !actuallyNeededCast(*type, *operand))) {
        context.addDiag(diag::UselessCast, syntax.apostrophe.location())
            << *operand->type << targetExpr.sourceRange << operand->sourceRange;
    }

    if (type->isAssignmentCompatible(*operand->type)) {
        // The type we propagate should use the sign of the operand, just like it
        // would if we were doing an implicit conversion via an assignment expression.
        auto propagatedType = type;
        if (type->isNumeric() && operand->type->isNumeric()) {
            propagatedType = OpInfo::binaryType(comp, type, operand->type, false,
                                                /* signednessFromRt */ true);
        }

        contextDetermined(context, operand, nullptr, *propagatedType, syntax.apostrophe.range(),
                          ConversionKind::Explicit);

        if (operand->kind == ExpressionKind::Conversion &&
            !operand->as<ConversionExpression>().isImplicit()) {
            operand->sourceRange = syntax.sourceRange();
            operand->type = type;
            return *operand;
        }
    }
    else {
        selfDetermined(context, operand);
    }

    return *result();
}